

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_strdup(char *str)

{
  FILE *__stream;
  size_t sVar1;
  char *dup;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    str_local = (char *)malloc(sVar1 + 1);
    __stream = _stderr;
    if (str_local == (char *)0x0) {
      sVar1 = strlen(str);
      fprintf(__stream,"** nifti_strdup: failed to alloc %u bytes\n",(ulong)((int)sVar1 + 1));
    }
    else {
      strcpy(str_local,str);
    }
  }
  return str_local;
}

Assistant:

char *nifti_strdup(const char *str)
{
  char *dup;

  if( !str ) return NULL;       /* allow calls passing NULL */

  dup = (char *)malloc(strlen(str) + 1);

  /* check for failure */
  if( dup ) strcpy(dup, str);
  else      fprintf(stderr,"** nifti_strdup: failed to alloc %u bytes\n",
                    (unsigned int)strlen(str)+1);

  return dup;
}